

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void codeconcat(FuncState *fs,expdesc *e1,expdesc *e2,int line)

{
  uint uVar1;
  Instruction *pIVar2;
  int n;
  Instruction *ie2;
  int line_local;
  expdesc *e2_local;
  expdesc *e1_local;
  FuncState *fs_local;
  
  pIVar2 = previousinstruction(fs);
  if ((*pIVar2 & 0x7f) == 0x35) {
    uVar1 = *pIVar2;
    freeexp(fs,e2);
    *pIVar2 = *pIVar2 & 0xffff807f | ((e1->u).info & 0xffU) << 7;
    *pIVar2 = *pIVar2 & 0xff00ffff | ((uVar1 >> 0x10 & 0xff) + 1 & 0xff) << 0x10;
  }
  else {
    luaK_codeABCk(fs,OP_CONCAT,(e1->u).info,2,0,0);
    freeexp(fs,e2);
    luaK_fixline(fs,line);
  }
  return;
}

Assistant:

static void codeconcat (FuncState *fs, expdesc *e1, expdesc *e2, int line) {
  Instruction *ie2 = previousinstruction(fs);
  if (GET_OPCODE(*ie2) == OP_CONCAT) {  /* is 'e2' a concatenation? */
    int n = GETARG_B(*ie2);  /* # of elements concatenated in 'e2' */
    lua_assert(e1->u.info + 1 == GETARG_A(*ie2));
    freeexp(fs, e2);
    SETARG_A(*ie2, e1->u.info);  /* correct first element ('e1') */
    SETARG_B(*ie2, n + 1);  /* will concatenate one more element */
  }
  else {  /* 'e2' is not a concatenation */
    luaK_codeABC(fs, OP_CONCAT, e1->u.info, 2, 0);  /* new concat opcode */
    freeexp(fs, e2);
    luaK_fixline(fs, line);
  }
}